

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(ON_SubDEdgePtr eptr)

{
  ON_SubDEdgeTag OVar1;
  byte bVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ON_SubD_ComponentIdTypeAndTag OVar3;
  ON_SubD_ComponentIdTypeAndTag itt;
  ON_SubD_ComponentIdTypeAndTag local_28;
  undefined1 local_18 [16];
  
  OVar3 = CreateFromEdge((ON_SubDEdge *)(eptr.m_ptr & 0xfffffffffffffff8));
  local_28._8_8_ = OVar3._8_8_;
  local_28.m_sharpness = OVar3.m_sharpness.m_edge_sharpness;
  local_18._8_4_ = extraout_XMM0_Dc;
  local_18._0_4_ = local_28.m_sharpness.m_edge_sharpness[0];
  local_18._4_4_ = local_28.m_sharpness.m_edge_sharpness[1];
  local_18._12_4_ = extraout_XMM0_Dd;
  OVar1 = EdgeTag(&local_28);
  if (OVar1 != Unset) {
    bVar2 = 0x70;
    if ((eptr.m_ptr & 1) == 0) {
      bVar2 = 0;
    }
    local_28.m_tag_and_dirx = bVar2 | local_28.m_tag_and_dirx & 7;
  }
  OVar3.m_id = local_28.m_id;
  OVar3.m_type = local_28.m_type;
  OVar3.m_tag_and_dirx = local_28.m_tag_and_dirx;
  OVar3.m_reserved = local_28.m_reserved;
  OVar3.m_sharpness.m_edge_sharpness[0] = (float)local_18._0_4_;
  OVar3.m_sharpness.m_edge_sharpness[1] = (float)local_18._4_4_;
  return OVar3;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(const class ON_SubDEdgePtr eptr)
{
  ON_SubD_ComponentIdTypeAndTag itt = ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(eptr.Edge());
  if (ON_SubDEdgeTag::Unset != itt.EdgeTag())
    itt.Internal_SetDir(0 == eptr.EdgeDirection() ? 0 : 1);
  return itt;
}